

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_hashes
          (ConcurrentDatabase *this,ResourceTag tag,ExportedMetadataConcurrentPrimedBlock *primed,
          uint64_t *total_count)

{
  DatabaseInterface *pDVar1;
  pointer puVar2;
  long lVar3;
  bool bVar4;
  ExportedMetadataConcurrentPrimedBlock *pEVar5;
  int iVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar9;
  ExportedMetadataConcurrentPrimedBlock *pEVar10;
  bool bVar11;
  size_t hash_count;
  long local_48;
  ExportedMetadataConcurrentPrimedBlock *local_40;
  uint64_t *local_38;
  
  local_48 = 0;
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar1 != (DatabaseInterface *)0x0) &&
     (iVar6 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,0), (char)iVar6 == '\0')) {
    return false;
  }
  pDVar1 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if ((pDVar1 == (DatabaseInterface *)0x0) ||
     (iVar6 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,primed),
     (char)iVar6 != '\0')) {
    pEVar10 = primed + local_48;
    puVar2 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_40 = primed;
    local_38 = total_count;
    for (puVar9 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar11 = puVar9 != puVar2, bVar11;
        puVar9 = puVar9 + 1) {
      local_48 = 0;
      pDVar1 = (puVar9->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar1 == (DatabaseInterface *)0x0) {
LAB_00115783:
        pDVar1 = (puVar9->_M_t).
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        if ((pDVar1 == (DatabaseInterface *)0x0) ||
           (iVar6 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48), (char)iVar6 != '\0'
           )) {
          pEVar10 = pEVar10 + local_48;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = false;
        iVar6 = (*pDVar1->_vptr_DatabaseInterface[6])(pDVar1,tag,&local_48,0);
        if ((char)iVar6 != '\0') goto LAB_00115783;
      }
      if (!bVar4) break;
    }
    pEVar5 = local_40;
    if (!bVar11) {
      if ((long)pEVar10 - (long)local_40 != 0) {
        uVar7 = (long)pEVar10 - (long)local_40 >> 3;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_40,pEVar10,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pEVar5,pEVar10);
      }
      puVar8 = std::__unique<unsigned_long*,__gnu_cxx::__ops::_Iter_equal_to_iter>(pEVar5,pEVar10);
      *local_38 = (long)puVar8 - (long)pEVar5 >> 3;
      return true;
    }
  }
  return false;
}

Assistant:

bool write_exported_concurrent_hashes(ResourceTag tag, ExportedMetadataConcurrentPrimedBlock *primed, uint64_t &total_count) const
	{
		auto *primed_begin = primed;
		size_t hash_count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return false;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, primed))
			return false;
		primed += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, primed))
				return false;
			primed += hash_count;
		}

		std::sort(primed_begin, primed);
		primed = std::unique(primed_begin, primed);
		total_count = size_t(primed - primed_begin);
		return true;
	}